

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

void __thiscall UDMFParser::ParseVertex(UDMFParser *this,vertex_t *vt,vertexdata_t *vd)

{
  bool bVar1;
  long lVar2;
  FName key;
  undefined1 local_44 [20];
  
  (vt->p).X = 0.0;
  (vt->p).Y = 0.0;
  vd->zCeiling = 0.0;
  vd->zFloor = 0.0;
  vd->flags = 0;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  bVar1 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (!bVar1) {
    do {
      UDMFParserBase::ParseKey((UDMFParserBase *)local_44,SUB81(this,0),(bool *)0x0);
      lVar2 = (long)(int)local_44._0_4_;
      if (lVar2 < 0x108) {
        if (local_44._0_4_ == 0xea) {
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar2].Text);
          }
          local_44._4_8_ = (this->super_UDMFParserBase).sc.Float;
        }
        else if (local_44._0_4_ == 0xeb) {
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar2].Text);
          }
          local_44._12_8_ = (this->super_UDMFParserBase).sc.Float;
        }
      }
      else if (local_44._0_4_ == 0x108) {
        if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Floating point value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar2].Text);
        }
        vd->zFloor = (this->super_UDMFParserBase).sc.Float;
        *(byte *)&vd->flags = (byte)vd->flags | 2;
      }
      else if (local_44._0_4_ == 0x109) {
        if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Floating point value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar2].Text);
        }
        vd->zCeiling = (this->super_UDMFParserBase).sc.Float;
        *(byte *)&vd->flags = (byte)vd->flags | 1;
      }
      bVar1 = FScanner::CheckToken((FScanner *)this,0x7d);
    } while (!bVar1);
  }
  (vt->p).X = (double)local_44._4_8_;
  (vt->p).Y = (double)local_44._12_8_;
  return;
}

Assistant:

void ParseVertex(vertex_t *vt, vertexdata_t *vd)
	{
		vt->set(0, 0);
		vd->zCeiling = vd->zFloor = vd->flags = 0;

		sc.MustGetToken('{');
		double x, y;
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch (key)
			{
			case NAME_X:
				x = CheckFloat(key);
				break;

			case NAME_Y:
				y = CheckFloat(key);
				break;

			case NAME_ZCeiling:
				vd->zCeiling = CheckFloat(key);
				vd->flags |= VERTEXFLAG_ZCeilingEnabled;
				break;

			case NAME_ZFloor:
				vd->zFloor = CheckFloat(key);
				vd->flags |= VERTEXFLAG_ZFloorEnabled;
				break;

			default:
				break;
			}
		}
		vt->set(x, y);
	}